

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossy.c
# Opt level: O1

int cmp_int64(void *_x,void *_y)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*_y <= *_x) {
    uVar1 = (uint)(*_y < *_x);
  }
  return uVar1;
}

Assistant:

static int cmp_int64(const void *_x, const void *_y)
{
    const int64_t *x = _x, *y = _y;
    if (*x < *y)
        return -1;
    if (*x > *y)
        return 1;
    return 0;
}